

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp.c
# Opt level: O1

void tcp_dial_res_cb(void *arg)

{
  nng_err result;
  nni_aio *pnVar1;
  nni_list *list;
  
  nni_mtx_lock((nni_mtx *)((long)arg + 0x588));
  if (*(char *)((long)arg + 0x148) == '\0') {
    pnVar1 = (nni_aio *)nni_list_first((nni_list *)((long)arg + 0x570));
    if (pnVar1 != (nni_aio *)0x0) {
      result = nni_aio_result((nni_aio *)((long)arg + 0x1e0));
      if (result == NNG_OK) {
        nni_tcp_dial(*(nni_tcp_dialer **)((long)arg + 0x1d8),(nni_sockaddr *)((long)arg + 0x150),
                     (nni_aio *)((long)arg + 0x3a8));
      }
      else {
        nni_list_remove((nni_list *)((long)arg + 0x570),pnVar1);
        nni_aio_finish_error(pnVar1,result);
        tcp_dial_start_next((tcp_dialer *)arg);
      }
      goto LAB_0013474f;
    }
  }
  list = (nni_list *)((long)arg + 0x570);
  pnVar1 = (nni_aio *)nni_list_first(list);
  while (pnVar1 != (nni_aio *)0x0) {
    nni_list_remove(list,pnVar1);
    nni_aio_finish_error(pnVar1,NNG_ECLOSED);
    pnVar1 = (nni_aio *)nni_list_first(list);
  }
LAB_0013474f:
  nni_mtx_unlock((nni_mtx *)((long)arg + 0x588));
  return;
}

Assistant:

static void
tcp_dial_res_cb(void *arg)
{
	tcp_dialer *d = arg;
	nni_aio    *aio;
	int         rv;

	nni_mtx_lock(&d->mtx);
	if (d->closed || ((aio = nni_list_first(&d->conaios)) == NULL)) {
		// ignore this.
		while ((aio = nni_list_first(&d->conaios)) != NULL) {
			nni_list_remove(&d->conaios, aio);
			nni_aio_finish_error(aio, NNG_ECLOSED);
		}
		nni_mtx_unlock(&d->mtx);
		return;
	}

	if ((rv = nni_aio_result(&d->resaio)) != 0) {
		nni_list_remove(&d->conaios, aio);
		nni_aio_finish_error(aio, rv);

		// try DNS again for next connection...
		tcp_dial_start_next(d);

	} else {
		nni_tcp_dial(d->d, &d->sa, &d->conaio);
	}

	nni_mtx_unlock(&d->mtx);
}